

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void __thiscall
Js::DynamicProfileInfo::Initialize(DynamicProfileInfo *this,FunctionBody *functionBody)

{
  Type TVar1;
  Type TVar2;
  FldInfo *pFVar3;
  ArrayCallSiteInfo *pAVar4;
  uint32 uVar5;
  ulong in_RAX;
  long lVar6;
  ScriptContext *pSVar7;
  ulong uVar8;
  ushort uVar9;
  ProfileId *pPVar10;
  uint uVar11;
  BVIndex start;
  undefined8 uStack_38;
  LoopFlags defaultValues;
  
  (this->thisInfo).valueType.field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  uStack_38 = in_RAX;
  uVar5 = FunctionBody::GetCountField(functionBody,LoopCount);
  if (uVar5 * 2 != 0) {
    BVFixed::Init((this->loopFlags).ptr,uVar5 * 2);
    uStack_38 = uStack_38 & 0xfcffffffffffffff;
    uVar5 = FunctionBody::GetCountField(functionBody,LoopCount);
    if (uVar5 != 0) {
      start = 0;
      uVar11 = 0;
      do {
        BVFixed::SetRange<Js::LoopFlags>
                  ((this->loopFlags).ptr,(LoopFlags *)((long)&uStack_38 + 7),start,2);
        uVar11 = uVar11 + 1;
        uVar5 = FunctionBody::GetCountField(functionBody,LoopCount);
        start = start + 2;
      } while (uVar11 < uVar5);
    }
  }
  if (functionBody->profiledCallSiteCount != 0) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
      ((long)&(((this->callSiteInfo).ptr)->returnType).field_0 + lVar6))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      *(undefined4 *)((long)&((this->callSiteInfo).ptr)->u + lVar6) = 0xffffffff;
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar8 < functionBody->profiledCallSiteCount);
  }
  uVar5 = FunctionBody::GetCountField(functionBody,ProfiledCallApplyCallSiteCount);
  if ((short)uVar5 != 0) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
      ((long)&(((this->callApplyTargetInfo).ptr)->returnType).field_0 + lVar6))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      *(undefined4 *)((long)&((this->callApplyTargetInfo).ptr)->u + lVar6) = 0xffffffff;
      uVar8 = uVar8 + 1;
      uVar5 = FunctionBody::GetCountField(functionBody,ProfiledCallApplyCallSiteCount);
      lVar6 = lVar6 + 0x10;
    } while (uVar8 < (uVar5 & 0xffff));
  }
  if (functionBody->profiledLdLenCount != 0) {
    uVar8 = 0;
    do {
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->ldLenInfo).ptr + uVar8))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledLdLenCount);
  }
  if (functionBody->profiledLdElemCount != 0) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
      ((long)&(((this->ldElemInfo).ptr)->arrayType).field_0 + lVar6))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
      ((long)&(((this->ldElemInfo).ptr)->elemType).field_0 + lVar6))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      (&((this->ldElemInfo).ptr)->flags)[lVar6] = FldInfo_NoInfo;
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 6;
    } while (uVar8 < functionBody->profiledLdElemCount);
  }
  if (functionBody->profiledStElemCount != 0) {
    uVar8 = 0;
    do {
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->stElemInfo).ptr + uVar8))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      (this->stElemInfo).ptr[uVar8].flags = FldInfo_NoInfo;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledStElemCount);
  }
  uVar5 = FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar5 != 0) {
    uVar8 = 0;
    do {
      pFVar3 = (this->fldInfo).ptr;
      pFVar3[uVar8].flags = FldInfo_NoInfo;
      ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(pFVar3 + uVar8))->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      (this->fldInfo).ptr[uVar8].polymorphicInlineCacheUtilization = 0x80;
      uVar8 = uVar8 + 1;
      uVar5 = FunctionBody::GetCountField(functionBody,InlineCacheCount);
    } while (uVar8 < uVar5);
  }
  if (functionBody->profiledDivOrRemCount != 0) {
    uVar8 = 0;
    do {
      (this->divideTypeInfo).ptr[uVar8].field_0.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledDivOrRemCount);
  }
  if (functionBody->profiledSwitchCount != 0) {
    uVar8 = 0;
    do {
      (this->switchTypeInfo).ptr[uVar8].field_0.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledSwitchCount);
  }
  if (functionBody->profiledSlotCount != 0) {
    uVar8 = 0;
    do {
      (this->slotInfo).ptr[uVar8].field_0.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledSlotCount);
  }
  if (1 < (functionBody->super_ParseableFunctionInfo).m_inParamCount) {
    uVar8 = 0;
    do {
      (this->parameterInfo).ptr[uVar8].field_0.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
      TVar1 = (functionBody->super_ParseableFunctionInfo).m_inParamCount;
      uVar9 = TVar1 - 1;
      if (TVar1 == 0) {
        uVar9 = 0;
      }
    } while (uVar8 < uVar9);
  }
  if (functionBody->profiledReturnTypeCount != 0) {
    uVar8 = 0;
    do {
      (this->returnTypeInfo).ptr[uVar8].field_0.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < functionBody->profiledReturnTypeCount);
  }
  this->rejitCount = 0;
  this->bailOutOffsetForLastRejit = 0xffffffff;
  uVar9 = functionBody->profiledArrayCallSiteCount;
  if ((ulong)uVar9 != 0) {
    TVar2 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber;
    pPVar10 = &((this->arrayCallSiteInfo).ptr)->callSiteNumber;
    uVar8 = 0;
    do {
      *(Type *)(pPVar10 + -2) = TVar2;
      *pPVar10 = (ProfileId)uVar8;
      uVar8 = uVar8 + 1;
      pPVar10 = pPVar10 + 6;
    } while (uVar9 != uVar8);
  }
  pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if ((pSVar7->threadContext->TTDLog != (EventLog *)0x0) &&
     (functionBody->profiledArrayCallSiteCount != 0)) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      pAVar4 = (this->arrayCallSiteInfo).ptr;
      if (DAT_015d346a == '\x01') {
        Output::TraceWithCallback<Js::ArrayCallSiteInfo::SetIsNotNativeArray()::__0>(0);
      }
      (&pAVar4->field_0)[lVar6].bits = '\x03';
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0xc;
    } while (uVar8 < functionBody->profiledArrayCallSiteCount);
  }
  return;
}

Assistant:

void DynamicProfileInfo::Initialize(FunctionBody *const functionBody)
    {
        // Need to make value types uninitialized, which is not equivalent to zero
        thisInfo.valueType = ValueType::Uninitialized;
        const BVIndex loopFlagsCount = functionBody->GetLoopCount() * LoopFlags::COUNT;
        if (loopFlagsCount)
        {
            this->loopFlags->Init(loopFlagsCount);
            LoopFlags defaultValues;
            for (uint i = 0; i < functionBody->GetLoopCount(); ++i)
            {
                this->loopFlags->SetRange(&defaultValues, i * LoopFlags::COUNT, LoopFlags::COUNT);
            }
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallSiteCount(); ++i)
        {
            callSiteInfo[i].returnType = ValueType::Uninitialized;
            callSiteInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallApplyCallSiteCount(); ++i)
        {
            callApplyTargetInfo[i].returnType = ValueType::Uninitialized;
            callApplyTargetInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdLenCount(); ++i)
        {
            ldLenInfo[i].arrayType = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdElemCount(); ++i)
        {
            ldElemInfo[i].arrayType = ValueType::Uninitialized;
            ldElemInfo[i].elemType = ValueType::Uninitialized;
            ldElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledStElemCount(); ++i)
        {
            stElemInfo[i].arrayType = ValueType::Uninitialized;
            stElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (uint i = 0; i < functionBody->GetProfiledFldCount(); ++i)
        {
            fldInfo[i].flags = FldInfo_NoInfo;
            fldInfo[i].valueType = ValueType::Uninitialized;
            fldInfo[i].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationThreshold;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledDivOrRemCount(); ++i)
        {
            divideTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSwitchCount(); ++i)
        {
            switchTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSlotCount(); ++i)
        {
            slotInfo[i] = ValueType::Uninitialized;
        }
        for (ArgSlot i = 0; i < functionBody->GetProfiledInParamsCount(); ++i)
        {
            parameterInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledReturnTypeCount(); ++i)
        {
            returnTypeInfo[i] = ValueType::Uninitialized;
        }

        this->rejitCount = 0;
        this->bailOutOffsetForLastRejit = Js::Constants::NoByteCodeOffset;
#if DBG
        for (ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
        {
            arrayCallSiteInfo[i].functionNumber = functionBody->GetFunctionNumber();
            arrayCallSiteInfo[i].callSiteNumber = i;
        }
#endif

#if TTD_NATIVE_PROFILE_ARRAY_WORK_AROUND
        if(functionBody->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
        {
            for(ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
            {
                arrayCallSiteInfo[i].SetIsNotNativeArray();
            }
        }
#endif
    }